

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::SeverityTask::eval
          (SeverityTask *this,EvalContext *context,Args *args,SourceRange sourceRange,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  ConstantValue *pCVar2;
  undefined8 *in_RCX;
  size_type in_RSI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDI;
  DiagCode code;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  Args argCopy;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_000000e8;
  EvalContext *in_stack_000000f0;
  Scope *in_stack_000000f8;
  nullptr_t in_stack_ffffffffffffff28;
  ConstantValue *in_stack_ffffffffffffff30;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  DiagCode local_8c;
  undefined4 local_88;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_50;
  pointer local_40;
  size_t local_38;
  
  local_40 = (pointer)*in_RCX;
  local_38 = in_RCX[1];
  this_00 = in_RDI;
  if (*(int *)(in_RSI + 0x38) == 0) {
    bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9c341b
                      );
    if (!bVar1) {
      local_50 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                           (this_00,(size_type)in_RDI,(size_type)in_stack_ffffffffffffff30);
      local_40 = local_50._M_ptr;
      local_38 = local_50._M_extent._M_extent_value;
    }
  }
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x9c3479);
  FmtHelpers::formatDisplay_abi_cxx11_(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x9c34a0);
  if (!bVar1) {
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_88 = 1;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x9c360f);
    return (ConstantValue *)this_00;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x9c34e8);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9c34f0);
  if (!bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x9c34fe);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (in_stack_ffffffffffffff50,in_RSI,(char *)this_00);
  }
  DiagCode::DiagCode(&local_8c);
  pCVar2 = (ConstantValue *)
           (*(code *)(&DAT_00b3f138 + *(int *)(&DAT_00b3f138 + (ulong)*(uint *)(in_RSI + 0x38) * 4))
           )();
  return pCVar2;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange sourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        auto argCopy = args;
        if (taskKind == ElabSystemTaskKind::Fatal && !args.empty())
            argCopy = args.subspan(1);

        auto str = FmtHelpers::formatDisplay(*callInfo.scope, context, argCopy);
        if (!str)
            return nullptr;

        if (!str->empty())
            str->insert(0, ": ");

        DiagCode code;
        switch (taskKind) {
            case ElabSystemTaskKind::Fatal:
                code = diag::FatalTask;
                break;
            case ElabSystemTaskKind::Error:
                code = diag::ErrorTask;
                break;
            case ElabSystemTaskKind::Warning:
                code = diag::WarningTask;
                break;
            case ElabSystemTaskKind::Info:
                code = diag::InfoTask;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        context.addDiag(code, sourceRange).addStringAllowEmpty(*str);

        // Return something valid here for info / warning; since this is a void-function or,
        // equivalently, a task, nothing will inspect the result, but we only want it to not
        // abort further evaluation for errors / fatals.
        if (taskKind == ElabSystemTaskKind::Info || taskKind == ElabSystemTaskKind::Warning)
            return ConstantValue::NullPlaceholder{};
        return nullptr;
    }